

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::SetInt64
          (OptionInterpreter *this,int number,int64_t value,Type type,
          UnknownFieldSet *unknown_fields)

{
  string_view str;
  Type local_1c;
  LogMessage local_18;
  
  local_1c = type;
  if (type == MAX_TYPE) {
    value = value >> 0x3f ^ value * 2;
  }
  else {
    if (type == TYPE_SFIXED64) {
      UnknownFieldSet::AddFixed64(unknown_fields,number,value);
      return;
    }
    if (type != TYPE_INT64) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_18,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                 ,0x2828);
      str._M_str = "Invalid wire type for CPPTYPE_INT64: ";
      str._M_len = 0x25;
      absl::lts_20250127::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                (&local_18,str);
      absl::lts_20250127::log_internal::LogMessage::
      operator<<<google::protobuf::internal::FieldDescriptorLite::Type,_0>(&local_18,&local_1c);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_18);
    }
  }
  UnknownFieldSet::AddVarint(unknown_fields,number,value);
  return;
}

Assistant:

void DescriptorBuilder::OptionInterpreter::SetInt64(
    int number, int64_t value, FieldDescriptor::Type type,
    UnknownFieldSet* unknown_fields) {
  switch (type) {
    case FieldDescriptor::TYPE_INT64:
      unknown_fields->AddVarint(number, static_cast<uint64_t>(value));
      break;

    case FieldDescriptor::TYPE_SFIXED64:
      unknown_fields->AddFixed64(number, static_cast<uint64_t>(value));
      break;

    case FieldDescriptor::TYPE_SINT64:
      unknown_fields->AddVarint(
          number, internal::WireFormatLite::ZigZagEncode64(value));
      break;

    default:
      ABSL_LOG(FATAL) << "Invalid wire type for CPPTYPE_INT64: " << type;
      break;
  }
}